

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O1

bool fs_exists(string_view path)

{
  string_view path_00;
  char cVar1;
  _Bool _Var2;
  bool bVar3;
  error_category *peVar4;
  char *in_RSI;
  size_t in_RDI;
  error_code ec;
  error_code local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  path local_48;
  
  local_68._M_value = 0;
  local_58._M_len = in_RDI;
  local_58._M_str = in_RSI;
  peVar4 = (error_category *)std::_V2::system_category();
  local_68._M_cat = peVar4;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&local_58,auto_format);
  cVar1 = std::filesystem::status(&local_48,&local_68);
  if (cVar1 != '\0') {
    local_68._M_value = 0;
    bVar3 = true;
    local_68._M_cat = peVar4;
    if (cVar1 != -1) goto LAB_00111a9d;
  }
  _Var2 = fs_is_msvc();
  if (_Var2) {
    path_00._M_str = local_58._M_str;
    path_00._M_len = local_58._M_len;
    bVar3 = fs_is_appexec_alias(path_00);
  }
  else {
    bVar3 = false;
  }
LAB_00111a9d:
  std::filesystem::__cxx11::path::~path(&local_48);
  return bVar3;
}

Assistant:

bool
fs_exists(std::string_view path)
{
  // fs_exists() is true even if path is non-readable
  // this is like Python pathlib.Path.exists()
  // unlike kwSys:SystemTools:FileExists which uses R_OK instead of F_OK like this project.

  bool ok;
#if defined(HAVE_CXX_FILESYSTEM)
  std::error_code ec;
  ok = (std::filesystem::exists(path, ec) && !ec) ||
        (fs_is_msvc() && fs_is_appexec_alias(path));
#elif defined(_WIN32)
  WIN32_FILE_ATTRIBUTE_DATA fad;
  ok = GetFileAttributesExA(path.data(), GetFileExInfoStandard, &fad);
#else
  // unistd.h
  ok = !access(path.data(), F_OK);
#endif

  return ok;
}